

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void draw_handle(int left,int top,bool filled,Am_Drawonable *draw,Am_Style *style,
                Am_Object *handle_obj)

{
  Am_Draw_Method_Type *this;
  bool bVar1;
  Am_Wrapper *pAVar2;
  Am_Object *pAVar3;
  Am_Value *value;
  Am_Object local_48;
  undefined1 local_40 [8];
  Am_Draw_Method draw_poly;
  Am_Object *handle_obj_local;
  Am_Style *style_local;
  Am_Drawonable *draw_local;
  bool filled_local;
  int top_local;
  int left_local;
  
  draw_poly.Call = (Am_Draw_Method_Type *)handle_obj;
  bVar1 = Am_Object::Valid(handle_obj);
  this = draw_poly.Call;
  if (bVar1) {
    if (filled) {
      pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(style);
      pAVar3 = Am_Object::Set((Am_Object *)this,0x6a,pAVar2,0);
      pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_No_Style);
      Am_Object::Set(pAVar3,0x6b,pAVar2,0);
    }
    else {
      pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_No_Style);
      pAVar3 = Am_Object::Set((Am_Object *)this,0x6a,pAVar2,0);
      pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_White);
      Am_Object::Set(pAVar3,0x6b,pAVar2,0);
    }
    value = Am_Object::Get((Am_Object *)draw_poly.Call,2000,0);
    Am_Draw_Method::Am_Draw_Method((Am_Draw_Method *)local_40,value);
    Am_Object::Am_Object(&local_48,(Am_Object *)draw_poly.Call);
    (*(code *)draw_poly.from_wrapper)(&local_48,draw,left,top);
    Am_Object::~Am_Object(&local_48);
  }
  else if (filled) {
    (*draw->_vptr_Am_Drawonable[0x2c])
              (draw,&Am_No_Style,style,(ulong)(uint)left,(ulong)(uint)top,0xd,0xd,0);
    (*draw->_vptr_Am_Drawonable[0x2c])
              (draw,&Am_White,&Am_No_Style,(ulong)(uint)left,(ulong)(uint)top,0xd,0xd,0);
  }
  else {
    (*draw->_vptr_Am_Drawonable[0x2c])
              (draw,style,&Am_No_Style,(ulong)(uint)left,(ulong)(uint)top,0xd,0xd,0);
  }
  return;
}

Assistant:

void
draw_handle(int left, int top, bool filled, Am_Drawonable *draw, Am_Style style,
            Am_Object &handle_obj //supports multiple users
            )
{
  if (handle_obj.Valid()) {
    // we have something other than rect to draw

    if (filled) {
      handle_obj.Set(Am_FILL_STYLE, style).Set(Am_LINE_STYLE, Am_No_Style);
    } else {
      handle_obj.Set(Am_FILL_STYLE, Am_No_Style).Set(Am_LINE_STYLE, Am_White);
    }
    Am_Draw_Method draw_poly = handle_obj.Get(Am_DRAW_METHOD);
    draw_poly.Call(handle_obj, draw, left, top);
  } else {
    if (filled) {
      draw->Draw_Rectangle(Am_No_Style, style, left, top, HANDLE_SIZE,
                           HANDLE_SIZE);
      //outline in white
      draw->Draw_Rectangle(Am_White, Am_No_Style, left, top, HANDLE_SIZE,
                           HANDLE_SIZE);
    } else
      draw->Draw_Rectangle(style, Am_No_Style, left, top, HANDLE_SIZE,
                           HANDLE_SIZE);
  }
}